

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

MipLevelProperties *
Diligent::GetMipLevelProperties
          (MipLevelProperties *__return_storage_ptr__,TextureDesc *TexDesc,Uint32 MipLevel)

{
  RESOURCE_DIMENSION RVar1;
  byte bVar2;
  Uint64 UVar3;
  Uint32 UVar4;
  uint uVar5;
  uint uVar6;
  Uint32 UVar7;
  uint uVar8;
  string msg;
  uint local_5c;
  string local_58;
  TextureFormatAttribs *local_38;
  
  __return_storage_ptr__->StorageWidth = 0;
  __return_storage_ptr__->StorageHeight = 0;
  __return_storage_ptr__->RowSize = 0;
  __return_storage_ptr__->DepthSliceSize = 0;
  __return_storage_ptr__->MipSize = 0;
  local_38 = GetTextureFormatAttribs(TexDesc->Format);
  bVar2 = (byte)MipLevel;
  uVar6 = TexDesc->Width >> (bVar2 & 0x1f);
  UVar4 = 1;
  uVar6 = uVar6 + (uVar6 == 0);
  __return_storage_ptr__->LogicalWidth = uVar6;
  RVar1 = TexDesc->Type;
  UVar7 = 1;
  if ((RVar1 & ~RESOURCE_DIM_BUFFER) != RESOURCE_DIM_TEX_1D) {
    UVar7 = TexDesc->Height;
  }
  uVar8 = UVar7 >> (bVar2 & 0x1f);
  uVar8 = uVar8 + (uVar8 == 0);
  __return_storage_ptr__->LogicalHeight = uVar8;
  if (RVar1 == RESOURCE_DIM_TEX_3D) {
    UVar4 = (TexDesc->field_3).ArraySize;
  }
  uVar5 = UVar4 >> (bVar2 & 0x1f);
  uVar5 = uVar5 + (uVar5 == 0);
  __return_storage_ptr__->Depth = uVar5;
  if (local_38->ComponentType == COMPONENT_TYPE_COMPRESSED) {
    bVar2 = local_38->BlockWidth;
    if ((bVar2 < 2) || (local_38->BlockHeight < 2)) {
      FormatString<char[26],char[56]>
                (&local_58,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"FmtAttribs.BlockWidth > 1 && FmtAttribs.BlockHeight > 1",
                 (char (*) [56])(ulong)MipLevel);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"GetMipLevelProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x814);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      bVar2 = local_38->BlockWidth;
    }
    if ((bVar2 & bVar2 - 1) != 0) {
      FormatString<char[52]>
                (&local_58,(char (*) [52])"Compressed block width is expected to be power of 2");
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"GetMipLevelProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x815);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_38->BlockHeight & local_38->BlockHeight - 1) != 0) {
      FormatString<char[53]>
                (&local_58,(char (*) [53])"Compressed block height is expected to be power of 2");
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"GetMipLevelProperties",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                 ,0x816);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    local_5c = (uint)local_38->BlockWidth;
    if ((local_5c ^ local_5c - 1) <= local_5c - 1) {
      FormatString<char[12],unsigned_int,char[23]>
                (&local_58,(Diligent *)"Alignment (",(char (*) [12])&local_5c,
                 (uint *)") must be a power of 2",(char (*) [23])local_38);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    uVar6 = -local_5c & (uVar6 + local_5c) - 1;
    __return_storage_ptr__->StorageWidth = uVar6;
    bVar2 = local_38->BlockHeight;
    local_5c = (uint)bVar2;
    if (((uint)bVar2 ^ bVar2 - 1) <= bVar2 - 1) {
      local_5c = (uint)bVar2;
      FormatString<char[12],unsigned_int,char[23]>
                (&local_58,(Diligent *)"Alignment (",(char (*) [12])&local_5c,
                 (uint *)") must be a power of 2",(char (*) [23])local_38);
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"AlignUp",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/../../../Common/interface/Align.hpp"
                 ,0x34);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      bVar2 = local_38->BlockHeight;
    }
    uVar8 = -local_5c & (uVar8 + local_5c) - 1;
    __return_storage_ptr__->StorageHeight = uVar8;
    UVar3 = (ulong)local_38->ComponentSize * ((ulong)uVar6 / (ulong)local_38->BlockWidth);
    __return_storage_ptr__->RowSize = UVar3;
    uVar8 = uVar8 / bVar2;
  }
  else {
    __return_storage_ptr__->StorageWidth = uVar6;
    __return_storage_ptr__->StorageHeight = uVar8;
    UVar3 = (ulong)local_38->NumComponents * (ulong)local_38->ComponentSize * (ulong)uVar6;
    __return_storage_ptr__->RowSize = UVar3;
  }
  __return_storage_ptr__->DepthSliceSize = uVar8 * UVar3;
  __return_storage_ptr__->MipSize = (ulong)uVar5 * uVar8 * UVar3;
  return __return_storage_ptr__;
}

Assistant:

MipLevelProperties GetMipLevelProperties(const TextureDesc& TexDesc, Uint32 MipLevel)
{
    MipLevelProperties          MipProps;
    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);

    MipProps.LogicalWidth  = std::max(TexDesc.GetWidth() >> MipLevel, 1u);
    MipProps.LogicalHeight = std::max(TexDesc.GetHeight() >> MipLevel, 1u);
    MipProps.Depth         = std::max(TexDesc.GetDepth() >> MipLevel, 1u);
    if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
    {
        VERIFY_EXPR(FmtAttribs.BlockWidth > 1 && FmtAttribs.BlockHeight > 1);
        VERIFY((FmtAttribs.BlockWidth & (FmtAttribs.BlockWidth - 1)) == 0, "Compressed block width is expected to be power of 2");
        VERIFY((FmtAttribs.BlockHeight & (FmtAttribs.BlockHeight - 1)) == 0, "Compressed block height is expected to be power of 2");
        // For block-compression formats, all parameters are still specified in texels rather than compressed texel blocks (18.4.1)
        MipProps.StorageWidth   = AlignUp(MipProps.LogicalWidth, Uint32{FmtAttribs.BlockWidth});
        MipProps.StorageHeight  = AlignUp(MipProps.LogicalHeight, Uint32{FmtAttribs.BlockHeight});
        MipProps.RowSize        = Uint64{MipProps.StorageWidth} / Uint32{FmtAttribs.BlockWidth} * Uint32{FmtAttribs.ComponentSize}; // ComponentSize is the block size
        MipProps.DepthSliceSize = MipProps.StorageHeight / Uint32{FmtAttribs.BlockHeight} * MipProps.RowSize;
        MipProps.MipSize        = MipProps.DepthSliceSize * MipProps.Depth;
    }
    else
    {
        MipProps.StorageWidth   = MipProps.LogicalWidth;
        MipProps.StorageHeight  = MipProps.LogicalHeight;
        MipProps.RowSize        = Uint64{MipProps.StorageWidth} * Uint32{FmtAttribs.ComponentSize} * Uint32{FmtAttribs.NumComponents};
        MipProps.DepthSliceSize = MipProps.RowSize * MipProps.StorageHeight;
        MipProps.MipSize        = MipProps.DepthSliceSize * MipProps.Depth;
    }

    return MipProps;
}